

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O3

Vec_Int_t * Gia_ManOrderWithBoxes(Gia_Man_t *p)

{
  uint iCiNum;
  Tim_Man_t *p_00;
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint iBox;
  uint uVar5;
  Vec_Int_t *p_01;
  int *piVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  Gia_Obj_t *pGVar11;
  long lVar12;
  int local_44;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  if (p_00 == (Tim_Man_t *)0x0) {
    __assert_fail("pManTime != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x124,"Vec_Int_t *Gia_ManOrderWithBoxes(Gia_Man_t *)");
  }
  iVar2 = Gia_ManIsNormalized(p);
  if (iVar2 == 0) {
    __assert_fail("Gia_ManIsNormalized( p )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x125,"Vec_Int_t *Gia_ManOrderWithBoxes(Gia_Man_t *)");
  }
  Gia_ManIncrementTravId(p);
  iVar2 = p->nObjs;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar3 = iVar2;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar3;
  if (iVar3 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar3 << 2);
  }
  p_01->pArray = piVar6;
  Vec_IntPush(p_01,0);
  if (p->nObjs < 1) {
LAB_00232d5f:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->nTravIdsAlloc < 1) {
LAB_00232d7e:
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  *p->pTravIds = p->nTravIds;
  uVar9 = 0;
  while (iVar2 = Tim_ManPiNum(p_00), (long)uVar9 < (long)iVar2) {
    if ((long)p->vCis->nSize <= (long)uVar9) goto LAB_00232d40;
    iVar2 = p->vCis->pArray[uVar9];
    if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00232d21;
    pGVar11 = p->pObjs + iVar2;
    Vec_IntPush(p_01,iVar2);
    pGVar1 = p->pObjs;
    if ((pGVar11 < pGVar1) || (pGVar1 + p->nObjs <= pGVar11)) goto LAB_00232d5f;
    uVar7 = ((long)pGVar11 - (long)pGVar1 >> 2) * -0x5555555555555555;
    iVar2 = (int)uVar7;
    if (p->nTravIdsAlloc <= iVar2) goto LAB_00232d7e;
    p->pTravIds[iVar2] = p->nTravIds;
    if (pGVar1 + p->nObjs <= pGVar11) goto LAB_00232d5f;
    uVar9 = uVar9 + 1;
    if (uVar9 != (uVar7 & 0xffffffff)) {
      __assert_fail("Gia_ObjId(p, pObj) == i+1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                    ,0x133,"Vec_Int_t *Gia_ManOrderWithBoxes(Gia_Man_t *)");
    }
  }
  local_44 = Tim_ManPiNum(p_00);
  iVar2 = Tim_ManBoxNum(p_00);
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    uVar8 = 0;
    do {
      iVar3 = Tim_ManBoxInputNum(p_00,uVar8);
      if (0 < iVar3) {
        uVar9 = 0;
        do {
          if ((iVar2 < 0) || ((long)p->vCos->nSize <= (long)((long)iVar2 + uVar9)))
          goto LAB_00232d40;
          iVar3 = p->vCos->pArray[(long)iVar2 + uVar9];
          if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_00232d21;
          iVar3 = Gia_ManOrderWithBoxes_rec
                            (p,p->pObjs + iVar3 +
                               -(ulong)((uint)*(undefined8 *)(p->pObjs + iVar3) & 0x1fffffff),p_01);
          if (iVar3 != 0) {
            iCiNum = p->iData2;
            iBox = Tim_ManBoxFindFromCiNum(p_00,iCiNum);
            puts("The command has to terminate. Boxes are not in a topological order.");
            puts("The following information may help debugging (numbers are 0-based):");
            iVar2 = Tim_ManBoxOutputFirst(p_00,uVar8);
            uVar5 = Tim_ManBoxInputFirst(p_00,uVar8);
            printf("Input %d of BoxA %d (1stCI = %d; 1stCO = %d) has TFI with CI %d,\n",
                   uVar9 & 0xffffffff,(ulong)uVar8,iVar2,(ulong)uVar5,(ulong)iCiNum);
            iVar2 = Tim_ManBoxOutputFirst(p_00,iBox);
            uVar8 = Tim_ManBoxOutputFirst(p_00,iBox);
            uVar5 = Tim_ManBoxInputFirst(p_00,iBox);
            printf("which corresponds to output %d of BoxB %d (1stCI = %d; 1stCO = %d).\n",
                   (ulong)(iCiNum - iVar2),(ulong)iBox,(ulong)uVar8,(ulong)uVar5);
            puts("In a correct topological order, BoxB should precede BoxA.");
            if (p_01->pArray != (int *)0x0) {
              free(p_01->pArray);
            }
            free(p_01);
            p->iData2 = 0;
            return (Vec_Int_t *)0x0;
          }
          uVar9 = uVar9 + 1;
          iVar3 = Tim_ManBoxInputNum(p_00,uVar8);
        } while ((long)uVar9 < (long)iVar3);
      }
      iVar3 = Tim_ManBoxInputNum(p_00,uVar8);
      if (0 < iVar3) {
        lVar12 = (long)iVar2;
        lVar10 = 0;
        do {
          if ((iVar2 < 0) || (p->vCos->nSize <= lVar12)) goto LAB_00232d40;
          iVar3 = p->vCos->pArray[lVar12];
          if ((iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_00232d21;
          Vec_IntPush(p_01,iVar3);
          lVar10 = lVar10 + 1;
          iVar3 = Tim_ManBoxInputNum(p_00,uVar8);
          lVar12 = lVar12 + 1;
        } while (lVar10 < iVar3);
      }
      iVar3 = Tim_ManBoxInputNum(p_00,uVar8);
      iVar4 = Tim_ManBoxOutputNum(p_00,uVar8);
      if (0 < iVar4) {
        lVar12 = (long)local_44;
        lVar10 = 0;
        do {
          if ((local_44 < 0) || (p->vCis->nSize <= lVar12)) goto LAB_00232d40;
          iVar4 = p->vCis->pArray[lVar12];
          if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_00232d21;
          pGVar11 = p->pObjs + iVar4;
          Vec_IntPush(p_01,iVar4);
          pGVar1 = p->pObjs;
          if ((pGVar11 < pGVar1) || (pGVar1 + p->nObjs <= pGVar11)) goto LAB_00232d5f;
          iVar4 = (int)((long)pGVar11 - (long)pGVar1 >> 2) * -0x55555555;
          if (p->nTravIdsAlloc <= iVar4) goto LAB_00232d7e;
          p->pTravIds[iVar4] = p->nTravIds;
          lVar10 = lVar10 + 1;
          iVar4 = Tim_ManBoxOutputNum(p_00,uVar8);
          lVar12 = lVar12 + 1;
        } while (lVar10 < iVar4);
      }
      iVar2 = iVar2 + iVar3;
      iVar3 = Tim_ManBoxOutputNum(p_00,uVar8);
      local_44 = local_44 + iVar3;
      uVar8 = uVar8 + 1;
      iVar3 = Tim_ManBoxNum(p_00);
    } while ((int)uVar8 < iVar3);
  }
  iVar3 = Tim_ManCoNum(p_00);
  iVar4 = Tim_ManPoNum(p_00);
  uVar8 = iVar3 - iVar4;
  iVar3 = Tim_ManCoNum(p_00);
  if ((int)uVar8 < iVar3) {
    uVar9 = (ulong)uVar8;
    do {
      if (((int)uVar8 < 0) || (p->vCos->nSize <= (int)uVar9)) goto LAB_00232d40;
      iVar3 = p->vCos->pArray[uVar9];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_00232d21;
      Gia_ManOrderWithBoxes_rec
                (p,p->pObjs + iVar3 + -(ulong)((uint)*(undefined8 *)(p->pObjs + iVar3) & 0x1fffffff)
                 ,p_01);
      uVar9 = uVar9 + 1;
      iVar3 = Tim_ManCoNum(p_00);
    } while ((int)uVar9 < iVar3);
  }
  iVar3 = Tim_ManCoNum(p_00);
  iVar4 = Tim_ManPoNum(p_00);
  uVar8 = iVar3 - iVar4;
  iVar3 = Tim_ManCoNum(p_00);
  if ((int)uVar8 < iVar3) {
    uVar9 = (ulong)uVar8;
    do {
      if (((int)uVar8 < 0) || (p->vCos->nSize <= (int)uVar9)) {
LAB_00232d40:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = p->vCos->pArray[uVar9];
      if ((iVar3 < 0) || (p->nObjs <= iVar3)) {
LAB_00232d21:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      Vec_IntPush(p_01,iVar3);
      uVar9 = uVar9 + 1;
      iVar3 = Tim_ManCoNum(p_00);
    } while ((int)uVar9 < iVar3);
  }
  iVar3 = Tim_ManPoNum(p_00);
  if (local_44 != p->vCis->nSize) {
    __assert_fail("curCi == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x16d,"Vec_Int_t *Gia_ManOrderWithBoxes(Gia_Man_t *)");
  }
  if (iVar3 + iVar2 == p->vCos->nSize) {
    return p_01;
  }
  __assert_fail("curCo == Gia_ManCoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                ,0x16e,"Vec_Int_t *Gia_ManOrderWithBoxes(Gia_Man_t *)");
}

Assistant:

Vec_Int_t * Gia_ManOrderWithBoxes( Gia_Man_t * p )
{
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int i, k, curCi, curCo;
    assert( pManTime != NULL );
    assert( Gia_ManIsNormalized( p ) );
    // start trav IDs
    Gia_ManIncrementTravId( p );
    // start the array
    vNodes = Vec_IntAlloc( Gia_ManObjNum(p) );
    // include constant
    Vec_IntPush( vNodes, 0 );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    // include primary inputs
    for ( i = 0; i < Tim_ManPiNum(pManTime); i++ )
    {
        pObj = Gia_ManCi( p, i );
        Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        Gia_ObjSetTravIdCurrent( p, pObj );
        assert( Gia_ObjId(p, pObj) == i+1 );
    }
    // for each box, include box nodes
    curCi = Tim_ManPiNum(pManTime);
    curCo = 0;
    for ( i = 0; i < Tim_ManBoxNum(pManTime); i++ )
    {
        // add internal nodes
        for ( k = 0; k < Tim_ManBoxInputNum(pManTime, i); k++ )
        {
            pObj = Gia_ManCo( p, curCo + k );
            if ( Gia_ManOrderWithBoxes_rec( p, Gia_ObjFanin0(pObj), vNodes ) )
            {
                int iCiNum  = p->iData2;
                int iBoxNum = Tim_ManBoxFindFromCiNum( pManTime, iCiNum );
                printf( "The command has to terminate. Boxes are not in a topological order.\n" );
                printf( "The following information may help debugging (numbers are 0-based):\n" );
                printf( "Input %d of BoxA %d (1stCI = %d; 1stCO = %d) has TFI with CI %d,\n", 
                    k, i, Tim_ManBoxOutputFirst(pManTime, i), Tim_ManBoxInputFirst(pManTime, i), iCiNum );
                printf( "which corresponds to output %d of BoxB %d (1stCI = %d; 1stCO = %d).\n", 
                    iCiNum - Tim_ManBoxOutputFirst(pManTime, iBoxNum), iBoxNum, 
                    Tim_ManBoxOutputFirst(pManTime, iBoxNum), Tim_ManBoxInputFirst(pManTime, iBoxNum) );
                printf( "In a correct topological order, BoxB should precede BoxA.\n" );
                Vec_IntFree( vNodes );
                p->iData2 = 0;
                return NULL;
            }
        }
        // add POs corresponding to box inputs
        for ( k = 0; k < Tim_ManBoxInputNum(pManTime, i); k++ )
        {
            pObj = Gia_ManCo( p, curCo + k );
            Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        }
        curCo += Tim_ManBoxInputNum(pManTime, i);
        // add PIs corresponding to box outputs
        for ( k = 0; k < Tim_ManBoxOutputNum(pManTime, i); k++ )
        {
            pObj = Gia_ManCi( p, curCi + k );
            Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
            Gia_ObjSetTravIdCurrent( p, pObj );
        }
        curCi += Tim_ManBoxOutputNum(pManTime, i);
    }
    // add remaining nodes
    for ( i = Tim_ManCoNum(pManTime) - Tim_ManPoNum(pManTime); i < Tim_ManCoNum(pManTime); i++ )
    {
        pObj = Gia_ManCo( p, i );
        Gia_ManOrderWithBoxes_rec( p, Gia_ObjFanin0(pObj), vNodes );
    }
    // add POs
    for ( i = Tim_ManCoNum(pManTime) - Tim_ManPoNum(pManTime); i < Tim_ManCoNum(pManTime); i++ )
    {
        pObj = Gia_ManCo( p, i );
        Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
    }
    curCo += Tim_ManPoNum(pManTime);
    // verify counts
    assert( curCi == Gia_ManCiNum(p) );
    assert( curCo == Gia_ManCoNum(p) );
    //assert( Vec_IntSize(vNodes) == Gia_ManObjNum(p) );
    return vNodes;
}